

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::RepeatedEventControlSyntax::setChild
          (RepeatedEventControlSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0040980c + *(int *)(&DAT_0040980c + index * 4)))();
  return;
}

Assistant:

void RepeatedEventControlSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: repeat = child.token(); return;
        case 1: openParen = child.token(); return;
        case 2: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 3: closeParen = child.token(); return;
        case 4: eventControl = child.node() ? &child.node()->as<TimingControlSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}